

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary.cpp
# Opt level: O0

int __thiscall CBoundary::AddWire(CBoundary *this,CWire *pWire)

{
  short sVar1;
  int iVar2;
  int iVar3;
  CNet *pCVar4;
  CLayer *pCVar5;
  CWire *pCStack_18;
  int iOldC;
  CWire *pWire_local;
  CBoundary *this_local;
  
  pCStack_18 = pWire;
  pWire_local = (CWire *)this;
  pCVar4 = CWire::GetParent(pWire);
  if (pCVar4 == (CNet *)0x0) {
    __assert_fail("pWire->GetParent()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Boundary.cpp"
                  ,0x89,"int CBoundary::AddWire(CWire *)");
  }
  iVar2 = CWire::IsRouted(pCStack_18);
  if (iVar2 == 0) {
    __assert_fail("pWire->IsRouted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Boundary.cpp"
                  ,0x8a,"int CBoundary::AddWire(CWire *)");
  }
  iVar2 = CWire::IsFlat(pCStack_18);
  if (iVar2 == 0) {
    __assert_fail("pWire->IsFlat()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Boundary.cpp"
                  ,0x8b,"int CBoundary::AddWire(CWire *)");
  }
  pCVar5 = CWire::GetLayer(pCStack_18);
  iVar2 = CLayer::Z(pCVar5);
  iVar3 = CPoint::Z(&this->super_CPoint);
  if (iVar2 == iVar3) {
    iVar2 = GetCongestion(this);
    iVar3 = IsFound(this,pCStack_18);
    if (iVar3 != 0) {
      __assert_fail("!IsFound(pWire)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Boundary.cpp"
                    ,0x92,"int CBoundary::AddWire(CWire *)");
    }
    std::vector<CWire_*,_std::allocator<CWire_*>_>::push_back
              (&this->m_Wire,&stack0xffffffffffffffe8);
    iVar3 = IsFound(this,pCStack_18);
    if (iVar3 != 0) {
      *(short *)&(this->super_CPoint).field_0x26 = *(short *)&(this->super_CPoint).field_0x26 + 2;
      this->m_iNumACap = this->m_iNumACap + -2;
      sVar1 = *(short *)&(this->super_CPoint).field_0x26;
      pCVar5 = GetParent(this);
      this->m_iCongestion = (short)((sVar1 * 100) / pCVar5->m_iMaxCapacity);
      pCVar5 = GetParent(this);
      CLayer::TrackCongestion(pCVar5,this,iVar2,(int)this->m_iCongestion);
      return 1;
    }
    __assert_fail("IsFound(pWire)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Boundary.cpp"
                  ,0x96,"int CBoundary::AddWire(CWire *)");
  }
  __assert_fail("pWire->GetLayer()->Z()==Z()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Boundary.cpp"
                ,0x8c,"int CBoundary::AddWire(CWire *)");
}

Assistant:

int CBoundary::AddWire(CWire *pWire)
{
	//!this is called from CNet::Addwire when a new *ROUTED* wire is added
	assert(pWire->GetParent());
	assert(pWire->IsRouted());
	assert(pWire->IsFlat());
	assert(pWire->GetLayer()->Z()==Z());

	//save old congestion number for TrackCongestion
	int		iOldC	=	GetCongestion();

	// each boundary has only one single pass from every net [6/30/2006 thyeros]
	assert(!IsFound(pWire));

	m_Wire.push_back(pWire);

	assert(IsFound(pWire));

    //! Notice: Did the same thing with @ref AdjustCapacity()
	// update occupied capacity [2/9/2007 thyeros]
	m_iNumOCap		+=	WIRE_WIDTH_SPACE;//(pWire->GetParent()->GetWidth()+GetParent()->GetDesignRule(GET_DR_MIN_WIR_SPACING));
	m_iNumACap		-=	WIRE_WIDTH_SPACE;//GetParent()->GetCapacity(GET_MODE_MAX)-m_iNumOCap;
	m_iCongestion	=	100*m_iNumOCap/GetParent()->m_iMaxCapacity;

	//update the congestion statictics in the parent layer
	GetParent()->TrackCongestion(this,iOldC,m_iCongestion);

	return	TRUE;
}